

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O3

void __thiscall aiMeshMorphKey::~aiMeshMorphKey(aiMeshMorphKey *this)

{
  if (((this->mNumValuesAndWeights != 0) && (this->mValues != (uint *)0x0)) &&
     (this->mWeights != (double *)0x0)) {
    operator_delete__(this->mValues);
    if (this->mWeights != (double *)0x0) {
      operator_delete__(this->mWeights);
      return;
    }
  }
  return;
}

Assistant:

~aiMeshMorphKey()
    {
        if (mNumValuesAndWeights && mValues && mWeights) {
            delete [] mValues;
            delete [] mWeights;
        }
    }